

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::FunctionCall::FunctionCall
          (FunctionCall *this,Context *c,Function *function,
          pool_ptr<soul::AST::CommaSeparatedList> *args,bool isMethod)

{
  CommaSeparatedList *pCVar1;
  SourceCodeText *pSVar2;
  
  pCVar1 = args->object;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ASTObject_002d4778;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.objectType =
       FunctionCall;
  pSVar2 = (c->location).sourceCode.object;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.location.
  sourceCode.object = pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.location.
  location.data = (c->location).location.data;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.parentScope
       = c->parentScope;
  (this->super_CallOrCastBase).super_Expression.kind = value;
  (this->super_CallOrCastBase).arguments.object = pCVar1;
  (this->super_CallOrCastBase).isMethodCall = isMethod;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CallOrCastBase_002d87b8;
  this->targetFunction = function;
  return;
}

Assistant:

FunctionCall (const Context& c, Function& function, pool_ptr<CommaSeparatedList> args, bool isMethod)
            : CallOrCastBase (ObjectType::FunctionCall, c, args, isMethod), targetFunction (function)
        {}